

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall
Js::TypedArray<unsigned_char,_true,_true>::DirectSetItem
          (TypedArray<unsigned_char,_true,_true> *this,uint32 index,Var value)

{
  BOOL BVar1;
  
  BVar1 = BaseTypedDirectSetItem(this,index,value,JavascriptConversion::ToUInt8Clamped);
  return BVar1;
}

Assistant:

inline BOOL Uint8ClampedVirtualArray::DirectSetItem(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItem(index, value, JavascriptConversion::ToUInt8Clamped);
    }